

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

void __thiscall TSMuxer::writePESPacket(TSMuxer *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  size_t sVar5;
  pointer ppVar6;
  AbstractStreamReader *pAVar7;
  pointer pmVar8;
  int iVar9;
  ulong uVar10;
  mapped_type *pmVar11;
  pointer puVar12;
  pointer puVar13;
  long lVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *buffer;
  pair<int,_int> *i;
  pointer ppVar17;
  int iVar18;
  bool bVar19;
  bool bVar20;
  pair<unsigned_long,_PMTIndexData> local_40;
  
  sVar5 = (this->m_pesData).m_size;
  if (sVar5 == 0) {
    return;
  }
  uVar10 = sVar5 - 6;
  if (uVar10 < 0x10000) {
    puVar13 = (this->m_pesData).m_data.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (puVar13 ==
        (this->m_pesData).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      puVar13 = (pointer)0x0;
    }
    puVar13[4] = (uchar)(uVar10 >> 8);
    puVar13 = (this->m_pesData).m_data.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (puVar13 ==
        (this->m_pesData).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      puVar13 = (pointer)0x0;
    }
    puVar13[5] = (uchar)uVar10;
  }
  pmVar11 = std::
            map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
            ::operator[](&(this->m_pmt).pidList,&this->m_pesPID);
  puVar13 = (this->m_pesData).m_data.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar19 = false;
  puVar12 = (pointer)0x0;
  if (puVar13 !=
      (this->m_pesData).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    puVar12 = puVar13;
  }
  if (this->m_computeMuxStats == true) {
    if ((char)puVar12[7] < '\0') {
      bVar1 = puVar12[9];
      bVar2 = puVar12[10];
      bVar3 = puVar12[0xb];
      uVar4 = *(ushort *)(puVar12 + 0xc);
      if ((pmVar11->m_index).
          super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (pmVar11->m_index).
          super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::
        vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
        ::emplace_back<>(&pmVar11->m_index);
      }
      pAVar7 = pmVar11->m_codecReader;
      bVar19 = true;
      if (pAVar7 != (AbstractStreamReader *)0x0) {
        lVar14 = __dynamic_cast(pAVar7,&AbstractStreamReader::typeinfo,&MPEGStreamReader::typeinfo,0
                               );
        bVar19 = lVar14 == 0;
      }
      iVar18 = (*(pAVar7->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[0x12])
                         (pAVar7);
      bVar20 = true;
      if (pmVar11->m_codecReader != (AbstractStreamReader *)0x0) {
        lVar14 = __dynamic_cast(pmVar11->m_codecReader,&AbstractStreamReader::typeinfo,
                                &SimplePacketizerReader::typeinfo,0);
        bVar20 = lVar14 == 0;
      }
      uVar10 = (ulong)((bVar3 & 0xfe) << 0xe | (uint)bVar2 << 0x16) |
               (ulong)(bVar1 >> 1 & 7) << 0x1e | (ulong)((ushort)(uVar4 << 8 | uVar4 >> 8) >> 1);
      if ((!bVar19) && (this->m_pesIFrame == true)) {
        if ((((char)iVar18 == '\0') || (this->m_pesSpsPps != false)) &&
           ((pmVar8 = (pmVar11->m_index).
                      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            pmVar8[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 ||
            (lVar14 = std::_Rb_tree_decrement
                                (&pmVar8[-1]._M_t._M_impl.super__Rb_tree_header._M_header),
            *(ulong *)(lVar14 + 0x20) < uVar10)))) {
          local_40.second.m_frameLen = 0;
          local_40.second.m_pktCnt =
               (this->m_muxedPacketCnt).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
          local_40.first = uVar10;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,PMTIndexData>,std::_Select1st<std::pair<unsigned_long_const,PMTIndexData>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,PMTIndexData>>>
          ::_M_emplace_unique<std::pair<unsigned_long,PMTIndexData>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,PMTIndexData>,std::_Select1st<std::pair<unsigned_long_const,PMTIndexData>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,PMTIndexData>>>
                      *)(pmVar8 + -1),&local_40);
          bVar19 = true;
        }
        else {
          bVar19 = false;
        }
        this->m_lastGopNullCnt = this->m_nullCnt;
        goto LAB_001daff8;
      }
      if (!bVar20) {
        if (this->m_videoSecondTrackCnt == 0 && this->m_videoTrackCnt == 0) {
          this->m_lastGopNullCnt = this->m_nullCnt;
        }
        pmVar8 = (pmVar11->m_index).
                 super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((pmVar8[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
           (lVar14 = std::_Rb_tree_decrement
                               (&pmVar8[-1]._M_t._M_impl.super__Rb_tree_header._M_header),
           89999 < uVar10 - *(long *)(lVar14 + 0x20))) {
          local_40.second.m_frameLen = 0;
          local_40.second.m_pktCnt =
               (this->m_muxedPacketCnt).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
          local_40.first = uVar10;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,PMTIndexData>,std::_Select1st<std::pair<unsigned_long_const,PMTIndexData>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,PMTIndexData>>>
          ::_M_emplace_unique<std::pair<unsigned_long,PMTIndexData>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,PMTIndexData>,std::_Select1st<std::pair<unsigned_long_const,PMTIndexData>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,PMTIndexData>>>
                      *)(pmVar8 + -1),&local_40);
          bVar19 = true;
          goto LAB_001daff8;
        }
      }
    }
    bVar19 = false;
  }
LAB_001daff8:
  puVar16 = (this->m_pesData).m_data.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar18 = 0;
  ppVar17 = (this->m_priorityData).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar15 = (uint8_t *)0x0;
  if (puVar16 !=
      (this->m_pesData).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    puVar15 = puVar16;
  }
  sVar5 = (this->m_pesData).m_size;
  ppVar6 = (this->m_priorityData).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar16 = puVar15;
  if (ppVar17 == ppVar6) {
    iVar18 = 1;
    bVar20 = true;
  }
  else {
    bVar20 = true;
    do {
      puVar13 = (this->m_pesData).m_data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (puVar13 ==
          (this->m_pesData).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        puVar13 = (pointer)0x0;
      }
      buffer = puVar13 + ppVar17->first;
      if (puVar16 <= buffer && (long)buffer - (long)puVar16 != 0) {
        iVar9 = writeTSFrames(this,this->m_pesPID,puVar16,(long)buffer - (long)puVar16,false,bVar20)
        ;
        iVar18 = iVar18 + iVar9;
        bVar20 = false;
      }
      iVar9 = writeTSFrames(this,this->m_pesPID,buffer,(long)ppVar17->second,true,bVar20);
      iVar18 = iVar9 + iVar18;
      puVar16 = buffer + ppVar17->second;
      ppVar17 = ppVar17 + 1;
    } while (ppVar17 != ppVar6);
    iVar18 = iVar18 + 1;
  }
  iVar9 = writeTSFrames(this,this->m_pesPID,puVar16,(int64_t)(puVar15 + (sVar5 - (long)puVar16)),
                        false,bVar20);
  (this->m_pesData).m_size = 0;
  ppVar17 = (this->m_priorityData).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_priorityData).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar17) {
    (this->m_priorityData).
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar17;
  }
  if (bVar19) {
    lVar14 = std::_Rb_tree_decrement
                       (&(pmVar11->m_index).
                         super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t._M_impl.
                         super__Rb_tree_header._M_header);
    if (*(int *)(lVar14 + 0x2c) != 0) {
      __assert_fail("curIndex.rbegin()->second.m_frameLen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                    ,0x347,"void TSMuxer::writePESPacket()");
    }
    *(int *)(lVar14 + 0x2c) = (iVar18 + iVar9) * this->m_frameSize;
  }
  return;
}

Assistant:

TSMuxer::TSMuxer(MuxerManager* owner) : AbstractMuxer(owner)
{
    m_m2tsMode = false;
    m_vbvLen = DEFAULT_VBV_BUFFER_LEN * 90;
    m_lastPESDTS = -1;
    m_cbrBitrate = -1;  // mux CBR if bitrate specifed
    m_minBitrate = -1;
    m_pcrOnVideo = true;
    m_endStreamDTS = 0;
    m_prevM2TSPCROffset = 0;
    m_pesPID = 0;
    m_lastTSIndex = -1;
    m_lastPesLen = -1;
    m_lastMuxedDts = -1;
    m_lastPCR = -1;
    m_lastPMTPCR = -1;
    m_lastSITPCR = -1;
    m_nullCnt = 0;
    m_pmtCnt = 0;
    m_patCnt = 0;
    m_sitCnt = 0;
    m_needTruncate = false;
    m_videoTrackCnt = 0;
    m_DVvideoTrackCnt = 0;
    m_videoSecondTrackCnt = 0;
    m_audioTrackCnt = 0;
    m_secondaryAudioTrackCnt = 0;
    m_pgsTrackCnt = 0;
    m_beforePCRDataWrited = false;
    m_useNewStyleAudioPES = false;
    m_minDts = -1;
    m_pcrBits = 0;
    m_pcr_delta = -1;
    m_patPmtDelta = -1;
    m_firstPts.push_back(-1);
    m_lastPts.push_back(-1);
    m_muxedPacketCnt.push_back(0);
    m_interleaveInfo.emplace_back();
    m_pesIFrame = false;
    m_pesSpsPps = false;
    m_computeMuxStats = false;
    m_pmtFrames = 0;
    m_curFileStartPts = 0;  // FIXED_PTS_OFFSET;
    m_splitSize = 0;
    m_splitDuration = 0;
    m_curFileNum = 0;
    m_bluRayMode = false;
    m_hdmvDescriptors = true;
    m_lastGopNullCnt = 0;
    m_outBufLen = 0;
    m_pesData.reserve(1024 * 128);
    m_mainStreamIndex = -1;
    m_muxFile = nullptr;
    m_isExternalFile = false;
    m_writeBlockSize = 0;
    m_frameSize = 188;

    m_processedBlockSize = 0;
    m_sublingMuxer = nullptr;
    m_outBuf = nullptr;
    m_masterMode = false;
    m_subMode = false;
    setPtsOffset(0);
    m_canSwithBlock = true;
    m_additionCLPISize = 0;
#ifdef _DEBUG
    m_lastProcessedDts = -1000000000;
    m_lastStreamIndex = -1;
#endif
}